

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot.hpp
# Opt level: O1

Result_t __thiscall
sig::Slot<void(int),std::function<void(int)>>::operator()
          (Slot<void(int),std::function<void(int)>> *this,int *args)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  bool bVar6;
  Locked_container_t l;
  int local_2c;
  Locked_container_t local_28;
  
  lVar2 = *(long *)(this + 8);
  lVar3 = *(long *)(this + 0x10);
  bVar6 = lVar2 != lVar3;
  if ((bVar6) && (*(long *)(lVar2 + 8) != 0)) {
    iVar1 = *(int *)(*(long *)(lVar2 + 8) + 8);
    while (iVar1 != 0) {
      lVar5 = lVar2 + 0x10;
      bVar6 = lVar5 != lVar3;
      if ((lVar5 == lVar3) || (*(long *)(lVar2 + 0x18) == 0)) break;
      iVar1 = *(int *)(*(long *)(lVar2 + 0x18) + 8);
      lVar2 = lVar5;
    }
  }
  if (!bVar6) {
    Slot_base::lock(&local_28,(Slot_base *)this);
    local_2c = *args;
    if (*(long *)(this + 0x30) == 0) {
      uVar4 = std::__throw_bad_function_call();
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
                (&local_28);
      _Unwind_Resume(uVar4);
    }
    (**(code **)(this + 0x38))(this + 0x20,&local_2c);
    std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector(&local_28);
  }
  return;
}

Assistant:

Result_t operator()(Arguments&&... args) const {
        if (this->expired()) {
            return Result_t();
        }
        auto l = this->lock();
        return function_(std::forward<Arguments>(args)...);
    }